

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMultiContextTests.cpp
# Opt level: O0

TestCaseGroup * deqp::egl::createMultiContextTests(EglTestContext *eglTestCtx)

{
  TestCaseGroup *pTVar1;
  MultiContextTest *pMVar2;
  DefaultDeleter<deqp::egl::TestCaseGroup> local_2d [13];
  undefined1 local_20 [8];
  MovePtr<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_> group;
  EglTestContext *eglTestCtx_local;
  
  group.super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>.
  m_data._8_8_ = eglTestCtx;
  pTVar1 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar1,(EglTestContext *)
                    group.
                    super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                    .m_data._8_8_,"multicontext","EGL multi context tests.");
  de::DefaultDeleter<deqp::egl::TestCaseGroup>::DefaultDeleter(local_2d);
  de::details::MovePtr<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>::
  MovePtr((MovePtr<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_> *)
          local_20,pTVar1);
  pTVar1 = de::details::
           UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>::
           operator->((UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                       *)local_20);
  pMVar2 = (MultiContextTest *)operator_new(0x80);
  anon_unknown_0::MultiContextTest::MultiContextTest
            (pMVar2,(EglTestContext *)
                    group.
                    super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                    .m_data._8_8_,SHARING_NONE,USE_NONE,"non_shared",
             "Create multiple non-shared contexts.");
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pMVar2);
  pTVar1 = de::details::
           UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>::
           operator->((UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                       *)local_20);
  pMVar2 = (MultiContextTest *)operator_new(0x80);
  anon_unknown_0::MultiContextTest::MultiContextTest
            (pMVar2,(EglTestContext *)
                    group.
                    super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                    .m_data._8_8_,SHARING_SHARED,USE_NONE,"shared",
             "Create multiple shared contexts.");
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pMVar2);
  pTVar1 = de::details::
           UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>::
           operator->((UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                       *)local_20);
  pMVar2 = (MultiContextTest *)operator_new(0x80);
  anon_unknown_0::MultiContextTest::MultiContextTest
            (pMVar2,(EglTestContext *)
                    group.
                    super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                    .m_data._8_8_,SHARING_NONE,USE_MAKECURRENT,"non_shared_make_current",
             "Create multiple non-shared contexts.");
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pMVar2);
  pTVar1 = de::details::
           UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>::
           operator->((UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                       *)local_20);
  pMVar2 = (MultiContextTest *)operator_new(0x80);
  anon_unknown_0::MultiContextTest::MultiContextTest
            (pMVar2,(EglTestContext *)
                    group.
                    super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                    .m_data._8_8_,SHARING_SHARED,USE_MAKECURRENT,"shared_make_current",
             "Create multiple shared contexts.");
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pMVar2);
  pTVar1 = de::details::
           UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>::
           operator->((UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                       *)local_20);
  pMVar2 = (MultiContextTest *)operator_new(0x80);
  anon_unknown_0::MultiContextTest::MultiContextTest
            (pMVar2,(EglTestContext *)
                    group.
                    super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                    .m_data._8_8_,SHARING_NONE,USE_CLEAR,"non_shared_clear",
             "Create multiple non-shared contexts.");
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pMVar2);
  pTVar1 = de::details::
           UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>::
           operator->((UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                       *)local_20);
  pMVar2 = (MultiContextTest *)operator_new(0x80);
  anon_unknown_0::MultiContextTest::MultiContextTest
            (pMVar2,(EglTestContext *)
                    group.
                    super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                    .m_data._8_8_,SHARING_SHARED,USE_CLEAR,"shared_clear",
             "Create multiple shared contexts.");
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pMVar2);
  pTVar1 = de::details::
           MovePtr<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>::release
                     ((MovePtr<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
                       *)local_20);
  de::details::MovePtr<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>::
  ~MovePtr((MovePtr<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_> *)
           local_20);
  return pTVar1;
}

Assistant:

TestCaseGroup* createMultiContextTests (EglTestContext& eglTestCtx)
{
	de::MovePtr<TestCaseGroup> group (new TestCaseGroup(eglTestCtx, "multicontext", "EGL multi context tests."));

	group->addChild(new MultiContextTest(eglTestCtx, MultiContextTest::SHARING_NONE,	MultiContextTest::USE_NONE,			"non_shared",				"Create multiple non-shared contexts."));
	group->addChild(new MultiContextTest(eglTestCtx, MultiContextTest::SHARING_SHARED,	MultiContextTest::USE_NONE,			"shared",					"Create multiple shared contexts."));

	group->addChild(new MultiContextTest(eglTestCtx, MultiContextTest::SHARING_NONE,	MultiContextTest::USE_MAKECURRENT,	"non_shared_make_current",	"Create multiple non-shared contexts."));
	group->addChild(new MultiContextTest(eglTestCtx, MultiContextTest::SHARING_SHARED,	MultiContextTest::USE_MAKECURRENT,	"shared_make_current",		"Create multiple shared contexts."));

	group->addChild(new MultiContextTest(eglTestCtx, MultiContextTest::SHARING_NONE,	MultiContextTest::USE_CLEAR,		"non_shared_clear",			"Create multiple non-shared contexts."));
	group->addChild(new MultiContextTest(eglTestCtx, MultiContextTest::SHARING_SHARED,	MultiContextTest::USE_CLEAR,		"shared_clear",				"Create multiple shared contexts."));

	return group.release();
}